

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O0

void __thiscall LoaderInstance::~LoaderInstance(LoaderInstance *this)

{
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_208;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  string local_1a8;
  ostringstream local_188 [8];
  ostringstream oss;
  LoaderInstance *this_local;
  
  this->_vptr_LoaderInstance = (_func_int **)&PTR__LoaderInstance_001b1988;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,"Destroying LoaderInstance = ");
  PointerToHexString<LoaderInstance>(&local_1a8,this);
  std::operator<<((ostream *)local_188,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,"xrDestroyInstance",&local_1c9);
  std::__cxx11::ostringstream::str();
  local_208.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector(&local_208);
  LoaderLogger::LogInfoMessage(&local_1c8,&local_1f0,&local_208);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_208);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
  ::~unique_ptr(&this->_dispatch_table);
  std::
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  ::~vector(&this->_api_layer_interfaces);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_enabled_extensions);
  return;
}

Assistant:

LoaderInstance::~LoaderInstance() {
    std::ostringstream oss;
    oss << "Destroying LoaderInstance = ";
    oss << PointerToHexString(this);
    LoaderLogger::LogInfoMessage("xrDestroyInstance", oss.str());
}